

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHtmlElement.cpp
# Opt level: O3

void __thiscall KDReports::HtmlElement::build(HtmlElement *this,ReportBuilder *builder)

{
  HtmlElementPrivate *pHVar1;
  TextDocumentData *this_00;
  int pos;
  int valueLength;
  
  TextDocumentData::aboutToModifyContents(builder->m_contentDocument,Append);
  pos = QTextCursor::position();
  QTextCursor::insertHtml((QString *)&builder->m_cursor);
  pHVar1 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::HtmlElementPrivate_*,_std::default_delete<KDReports::HtmlElementPrivate>_>
           .super__Head_base<0UL,_KDReports::HtmlElementPrivate_*,_false>._M_head_impl;
  if (*(qsizetype *)((long)&(pHVar1->m_id).d + 0x10) != 0) {
    this_00 = builder->m_contentDocument;
    valueLength = QTextCursor::position();
    TextDocumentData::setTextValueMarker(this_00,pos,&pHVar1->m_id,valueLength,false);
    return;
  }
  return;
}

Assistant:

void KDReports::HtmlElement::build(ReportBuilder &builder) const
{
    QTextCursor &cursor = builder.cursor();
    const int charPosition = cursor.position();
    cursor.insertHtml(d->m_html);
    if (!d->m_id.isEmpty())
        builder.currentDocumentData().setTextValueMarker(charPosition, d->m_id, cursor.position(), false);
}